

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t HUF_readStats_wksp(BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,
                         U32 *tableLogPtr,void *src,size_t srcSize,void *workSpace,size_t wkspSize,
                         int flags)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  size_t sVar7;
  
  if ((flags & 1U) != 0) {
    sVar7 = HUF_readStats_body_bmi2
                      (huffWeight,hwSize,rankStats,nbSymbolsPtr,tableLogPtr,src,srcSize,workSpace,
                       wkspSize);
    return sVar7;
  }
  sVar7 = 0xffffffffffffffb8;
  if (srcSize != 0) {
    uVar2 = (ulong)*src;
    sVar7 = 0xffffffffffffffec;
    if ((char)*src < '\0') {
      uVar4 = uVar2 - 0x7e >> 1;
      if (srcSize <= uVar4) {
        return 0xffffffffffffffb8;
      }
      uVar1 = uVar2 - 0x7f;
      if (hwSize <= uVar1) {
        return 0xffffffffffffffec;
      }
      pbVar6 = (byte *)((long)src + 1);
      for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 2) {
        huffWeight[uVar2] = *pbVar6 >> 4;
        huffWeight[uVar2 + 1] = *pbVar6 & 0xf;
        pbVar6 = pbVar6 + 1;
      }
    }
    else {
      if (srcSize <= uVar2) {
        return 0xffffffffffffffb8;
      }
      uVar1 = FSE_decompress_wksp_bmi2
                        (huffWeight,hwSize - 1,(void *)((long)src + 1),uVar2,6,workSpace,wkspSize,0)
      ;
      uVar4 = uVar2;
      if (0xffffffffffffff88 < uVar1) {
        return uVar1;
      }
    }
    rankStats[8] = 0;
    rankStats[9] = 0;
    rankStats[10] = 0;
    rankStats[0xb] = 0;
    rankStats[4] = 0;
    rankStats[5] = 0;
    rankStats[6] = 0;
    rankStats[7] = 0;
    rankStats[0xc] = 0;
    rankStats[0] = 0;
    rankStats[1] = 0;
    rankStats[2] = 0;
    rankStats[3] = 0;
    uVar5 = 0;
    for (uVar3 = 0; uVar2 = (ulong)uVar3, uVar2 < uVar1; uVar3 = uVar3 + 1) {
      if (0xc < (ulong)huffWeight[uVar2]) {
        return 0xffffffffffffffec;
      }
      rankStats[huffWeight[uVar2]] = rankStats[huffWeight[uVar2]] + 1;
      uVar5 = uVar5 + ((1 << (huffWeight[uVar2] & 0x1f)) >> 1);
    }
    if (uVar5 != 0) {
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      if (uVar3 < 0xc) {
        *tableLogPtr = 0x20 - (uVar3 ^ 0x1f);
        uVar5 = (2 << ((byte)uVar3 & 0x1f)) - uVar5;
        uVar3 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        if (1 << ((byte)uVar3 & 0x1f) == uVar5) {
          uVar3 = 0x20 - (uVar3 ^ 0x1f);
          huffWeight[uVar1] = (BYTE)uVar3;
          rankStats[uVar3] = rankStats[uVar3] + 1;
          if ((rankStats[1] & 1) == 0 && 1 < rankStats[1]) {
            *nbSymbolsPtr = (int)uVar1 + 1;
            sVar7 = uVar4 + 1;
          }
        }
      }
    }
  }
  return sVar7;
}

Assistant:

size_t HUF_readStats_wksp(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize,
                     int flags)
{
#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        return HUF_readStats_body_bmi2(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
    }
#endif
    (void)flags;
    return HUF_readStats_body_default(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize);
}